

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreConstruct.cpp
# Opt level: O1

void mathCore::dual(expression *a)

{
  bool bVar1;
  uint uVar2;
  
  bVar1 = is_literal(a);
  uVar2 = 4;
  if (!bVar1) {
    bVar1 = is_var(a);
    uVar2 = 8;
    if (bVar1) {
      return;
    }
  }
  a->FLAGS = a->FLAGS ^ uVar2;
  return;
}

Assistant:

void mathCore::dual(expression* a) {
	if (mathCore::is_literal(a)) {
		// Dual of a Literal is its negation
		mathCore::negate(a);
	}
	else if (!mathCore::is_var(a)){
		// If its not a varible you flip its dual
		a->FLAGS ^= F_DUAL;
	}
}